

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ReplaceObsoleteElements(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = node;
  while (next = pNVar1, next != (Node *)0x0) {
    pNVar1 = next->next;
    if (((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_DIR)) {
      prvTidyCoerceNode(doc,next,TidyTag_UL,yes,yes);
    }
    if (((((next != (Node *)0x0) && (next->tag != (Dict *)0x0)) && (next->tag->id == TidyTag_XMP))
        || (((next != (Node *)0x0 && (next->tag != (Dict *)0x0)) &&
            (next->tag->id == TidyTag_LISTING)))) ||
       ((next->tag != (Dict *)0x0 && (next->tag->id == TidyTag_PLAINTEXT)))) {
      prvTidyCoerceNode(doc,next,TidyTag_PRE,yes,yes);
    }
    if (next->content != (Node *)0x0) {
      ReplaceObsoleteElements(doc,next->content);
    }
  }
  return;
}

Assistant:

static void ReplaceObsoleteElements(TidyDocImpl* doc, Node* node)
{
    Node *next;

    while (node)
    {
        next = node->next;

        /* if (nodeIsDIR(node) || nodeIsMENU(node)) */
        /* HTML5 - <menu ... > is no longer obsolete */
        if (nodeIsDIR(node))
            TY_(CoerceNode)(doc, node, TidyTag_UL, yes, yes);

        if (nodeIsXMP(node) || nodeIsLISTING(node) ||
            (node->tag && node->tag->id == TidyTag_PLAINTEXT))
            TY_(CoerceNode)(doc, node, TidyTag_PRE, yes, yes);

        if (node->content)
            ReplaceObsoleteElements(doc, node->content);

        node = next;
    }
}